

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O0

void __thiscall
CoreML::TreeEnsembleBase::setDefaultPredictionValue
          (TreeEnsembleBase *this,vector<double,_std::allocator<double>_> *v)

{
  TreeEnsembleParameters *this_00;
  bool bVar1;
  reference pdVar2;
  size_type value;
  double e;
  const_iterator __end1;
  const_iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  vector<double,_std::allocator<double>_> *v_local;
  TreeEnsembleBase *this_local;
  
  Specification::TreeEnsembleParameters::clear_basepredictionvalue(this->tree_parameters);
  __end1 = std::vector<double,_std::allocator<double>_>::begin(v);
  e = (double)std::vector<double,_std::allocator<double>_>::end(v);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&e);
    if (!bVar1) break;
    pdVar2 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1);
    Specification::TreeEnsembleParameters::add_basepredictionvalue(this->tree_parameters,*pdVar2);
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  this_00 = this->tree_parameters;
  value = std::vector<double,_std::allocator<double>_>::size(v);
  Specification::TreeEnsembleParameters::set_numpredictiondimensions(this_00,value);
  return;
}

Assistant:

void TreeEnsembleBase::setDefaultPredictionValue(const std::vector<double>& v) {
        tree_parameters->clear_basepredictionvalue();
        for(double e : v) {
            tree_parameters->add_basepredictionvalue(e);
        }

        tree_parameters->set_numpredictiondimensions(v.size());
    }